

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hpp
# Opt level: O0

ostream * pg::operator<<(ostream *out,_label_vertex *lv)

{
  int iVar1;
  long lVar2;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  string *l;
  _label_vertex *lv_local;
  ostream *out_local;
  
  if ((lv->v < 0) || (iVar1 = lv->v, lVar2 = Game::nodecount(lv->g), lVar2 <= iVar1)) {
    std::operator<<(out,"<N/A>");
  }
  else {
    psVar3 = Game::rawlabel_abi_cxx11_(lv->g,lv->v);
    if ((psVar3 == (string *)0x0) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
      poVar5 = (ostream *)std::ostream::operator<<(out,lv->v);
      poVar5 = std::operator<<(poVar5,"/");
      iVar1 = Game::priority(lv->g,lv->v);
      std::ostream::operator<<(poVar5,iVar1);
    }
    else {
      std::operator<<(out,(string *)psVar3);
    }
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const _label_vertex &lv) {
            if (lv.v < 0 or lv.v >= lv.g.nodecount()) {
                out << "<N/A>";
            } else {
                std::string* l = lv.g.rawlabel(lv.v);
                if (l == nullptr or l->empty()) out << lv.v << "/" << lv.g.priority(lv.v);
                else out << *l;
            }
            return out;
        }